

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdconntable.c
# Opt level: O3

void initStdConnTable(void)

{
  StdResConnTableEntry_t *pSVar1;
  StdResConnTableEntry_t *elem;
  
  memset(StdResTblBucket,0,0x51c8);
  if (StandardResAtomConnRec[0].key != (char *)0x0) {
    elem = StandardResAtomConnRec;
    do {
      InsertInStdResConnTable(elem);
      pSVar1 = elem + 1;
      elem = elem + 1;
    } while (pSVar1->key != (char *)0x0);
  }
  return;
}

Assistant:

void initStdConnTable() {
   StdResConnTableEntry_t *r;
   int i;

   for (i = 0; i < M; i++) { /* empty all the buckets */
      StdResTblBucket[i] = NULL;
   }

   for( r = StandardResAtomConnRec; r->key != NULL; r++) {
      InsertInStdResConnTable(r);
   }
}